

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_tools.cpp
# Opt level: O2

void __thiscall miniros::network::HttpFrame::resetParseState(HttpFrame *this)

{
  std::
  vector<miniros::network::HttpFrame::Field,_std::allocator<miniros::network::HttpFrame::Field>_>::
  clear(&this->fields);
  (this->requestType).start = -1;
  (this->requestType).end = -1;
  (this->requestUrl).start = -1;
  (this->requestUrl).end = -1;
  (this->requestHttpVersion).start = -1;
  (this->requestHttpVersion).end = -1;
  this->m_currentPosition = 0;
  this->m_bodyPosition = 0;
  this->m_bodyEnd = 0;
  this->m_tokenStart = 0;
  this->m_contentLength = -1;
  (this->m_fieldName).start = -1;
  (this->m_fieldName).end = -1;
  this->m_keepAlive = true;
  this->m_state = ParseRequest;
  return;
}

Assistant:

void HttpFrame::resetParseState()
{
  fields.clear();
  requestType = {};
  requestUrl = {};
  requestHttpVersion = {};

  m_currentPosition = 0;
  m_bodyPosition = 0;
  m_bodyEnd = 0;
  m_tokenStart = 0;

  m_contentLength = -1;

  m_fieldName = {};

  m_keepAlive = true;

  m_state = HttpFrame::ParseRequest;
}